

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

void __thiscall DIntermissionScreen::Destroy(DIntermissionScreen *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  if (this->mPaletteChanged == true) {
    iVar1 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1a])();
    lVar2 = 0;
    do {
      *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(CONCAT44(extraout_var,iVar1) + lVar2 * 4) =
           GPalette.BaseColors[lVar2].field_0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x100);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x1c])();
    NoWipe = 5;
    this->mPaletteChanged = false;
    M_EnableMenu(true);
  }
  S_StopSound(2);
  DObject::Destroy(&this->super_DObject);
  return;
}

Assistant:

void DIntermissionScreen::Destroy()
{
	if (mPaletteChanged)
	{
		PalEntry *palette;
		int i;

		palette = screen->GetPalette ();
		for (i = 0; i < 256; ++i)
		{
			palette[i] = GPalette.BaseColors[i];
		}
		screen->UpdatePalette ();
		NoWipe = 5;
		mPaletteChanged = false;
		M_EnableMenu(true);
	}
	S_StopSound(CHAN_VOICE);
	Super::Destroy();
}